

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::ReturnStmt::set_parent(ReturnStmt *this,IRNode *parent)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  FunctionStmtBlock *this_01;
  bool bVar1;
  uint32_t width;
  bool *pbVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_48 [8];
  shared_ptr<kratos::AssignStmt> s;
  shared_ptr<kratos::Var> p;
  IRNode *parent_local;
  ReturnStmt *this_local;
  
  Stmt::set_parent(&this->super_Stmt,parent);
  FunctionStmtBlock::set_has_return_value(this->func_def_,true);
  FunctionStmtBlock::function_handler
            ((FunctionStmtBlock *)
             &p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_01 = this->func_def_;
    peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->value_);
    width = (*(peVar3->super_IRNode)._vptr_IRNode[7])();
    peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->value_);
    pbVar2 = Var::is_signed(peVar3);
    FunctionStmtBlock::create_function_handler(this_01,width,(bool)(*pbVar2 & 1));
  }
  this_00 = &s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  FunctionStmtBlock::function_handler((FunctionStmtBlock *)this_00);
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this_00);
  Var::assign((Var *)local_48,(shared_ptr<kratos::Var> *)peVar3,(int)this + 200);
  peVar4 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  (*(peVar4->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar4,this);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_48);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ReturnStmt::set_parent(kratos::IRNode *parent) {
    Stmt::set_parent(parent);
    // looping to make sure there is a function statement block
    // it will never be 10k deep. this is to avoid infinite loop when construction failed
    /* comment this out because can only be determined after every statements has been set
     * TODO:
     * add a pass to analysis returns
    }
     */
    func_def_->set_has_return_value(true);
    // need to handle the assignments
    if (!func_def_->function_handler()) {
        // create a function handler
        func_def_->create_function_handler(value_->width(), value_->is_signed());
    }
    auto p = func_def_->function_handler();
    auto s = p->assign(value_, AssignmentType::Blocking);
    s->set_parent(this);
}